

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# omptarget.cpp
# Opt level: O0

int omp_target_memcpy_rect
              (void *dst,void *src,size_t element_size,int num_dims,size_t *volume,
              size_t *dst_offsets,size_t *src_offsets,size_t *dst_dimensions,size_t *src_dimensions,
              int dst_device,int src_device)

{
  int in_ECX;
  void *in_RDX;
  int unaff_EBX;
  void *in_RSI;
  long in_RDI;
  ulong *in_R8;
  size_t *in_R9;
  size_t *unaff_retaddr;
  size_t *in_stack_00000008;
  size_t *in_stack_00000010;
  int in_stack_00000018;
  undefined4 in_stack_0000001c;
  int in_stack_00000020;
  size_t i_1;
  size_t src_off;
  size_t dst_off;
  int i;
  size_t src_slice_size;
  size_t dst_slice_size;
  int rc;
  ulong local_80;
  int local_64;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffc8;
  int local_14;
  
  if ((in_RDI == 0) && (in_RSI == (void *)0x0)) {
    local_14 = 0x7fffffff;
  }
  else if ((((in_RDI == 0) ||
            ((((in_RSI == (void *)0x0 || (in_RDX == (void *)0x0)) || (in_ECX < 1)) ||
             ((in_R8 == (ulong *)0x0 || (in_R9 == (size_t *)0x0)))))) ||
           (in_stack_00000008 == (size_t *)0x0)) ||
          ((in_stack_00000010 == (size_t *)0x0 ||
           (CONCAT44(in_stack_0000001c,in_stack_00000018) == 0)))) {
    local_14 = -1;
  }
  else if (in_ECX == 1) {
    local_14 = omp_target_memcpy(in_RSI,in_RDX,CONCAT44(1,in_stack_ffffffffffffffc8),(size_t)in_R8,
                                 (size_t)in_R9,in_stack_ffffffffffffffb4,unaff_EBX);
  }
  else {
    for (local_64 = 1; local_64 < in_ECX; local_64 = local_64 + 1) {
    }
    local_80 = 0;
    while ((local_14 = in_stack_ffffffffffffffb4, local_80 < *in_R8 &&
           (in_stack_ffffffffffffffb4 =
                 omp_target_memcpy_rect
                           (in_RSI,in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffc8),
                            (int)((ulong)in_R8 >> 0x20),in_R9,
                            (size_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                            unaff_retaddr,in_stack_00000008,in_stack_00000010,in_stack_00000018,
                            in_stack_00000020), local_14 = in_stack_ffffffffffffffb4,
           in_stack_ffffffffffffffb4 == 0))) {
      local_80 = local_80 + 1;
    }
  }
  return local_14;
}

Assistant:

EXTERN int omp_target_memcpy_rect(void *dst, void *src, size_t element_size,
    int num_dims, const size_t *volume, const size_t *dst_offsets,
    const size_t *src_offsets, const size_t *dst_dimensions,
    const size_t *src_dimensions, int dst_device, int src_device) {
  DP("Call to omp_target_memcpy_rect, dst device %d, src device %d, "
      "dst addr " DPxMOD ", src addr " DPxMOD ", dst offsets " DPxMOD ", "
      "src offsets " DPxMOD ", dst dims " DPxMOD ", src dims " DPxMOD ", "
      "volume " DPxMOD ", element size %zu, num_dims %d\n", dst_device,
      src_device, DPxPTR(dst), DPxPTR(src), DPxPTR(dst_offsets),
      DPxPTR(src_offsets), DPxPTR(dst_dimensions), DPxPTR(src_dimensions),
      DPxPTR(volume), element_size, num_dims);

  if (!(dst || src)) {
    DP("Call to omp_target_memcpy_rect returns max supported dimensions %d\n",
        INT_MAX);
    return INT_MAX;
  }

  if (!dst || !src || element_size < 1 || num_dims < 1 || !volume ||
      !dst_offsets || !src_offsets || !dst_dimensions || !src_dimensions) {
    DP("Call to omp_target_memcpy_rect with invalid arguments\n");
    return OFFLOAD_FAIL;
  }

  int rc;
  if (num_dims == 1) {
    rc = omp_target_memcpy(dst, src, element_size * volume[0],
        element_size * dst_offsets[0], element_size * src_offsets[0],
        dst_device, src_device);
  } else {
    size_t dst_slice_size = element_size;
    size_t src_slice_size = element_size;
    for (int i=1; i<num_dims; ++i) {
      dst_slice_size *= dst_dimensions[i];
      src_slice_size *= src_dimensions[i];
    }

    size_t dst_off = dst_offsets[0] * dst_slice_size;
    size_t src_off = src_offsets[0] * src_slice_size;
    for (size_t i=0; i<volume[0]; ++i) {
      rc = omp_target_memcpy_rect((char *) dst + dst_off + dst_slice_size * i,
          (char *) src + src_off + src_slice_size * i, element_size,
          num_dims - 1, volume + 1, dst_offsets + 1, src_offsets + 1,
          dst_dimensions + 1, src_dimensions + 1, dst_device, src_device);

      if (rc) {
        DP("Recursive call to omp_target_memcpy_rect returns unsuccessfully\n");
        return rc;
      }
    }
  }

  DP("omp_target_memcpy_rect returns %d\n", rc);
  return rc;
}